

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O1

void __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::SetTrackerData
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this,void *address,void *data)

{
  ushort uVar1;
  undefined4 *puVar2;
  TrackerData *pTVar3;
  code *pcVar4;
  bool bVar5;
  ushort uVar6;
  long lVar7;
  undefined8 *in_FS_OFFSET;
  
  bVar5 = Recycler::DoProfileAllocTracker();
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x8da,"(Recycler::DoProfileAllocTracker())",
                       "Recycler::DoProfileAllocTracker()");
    if (!bVar5) goto LAB_0020536c;
    *puVar2 = 0;
  }
  uVar6 = GetAddressIndex(this,address);
  if (uVar6 == 0xffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x8dc,"(index != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit)",
                       "index != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit");
    if (!bVar5) goto LAB_0020536c;
    *puVar2 = 0;
  }
  uVar1 = this->objectCount;
  bVar5 = Recycler::DoProfileAllocTracker();
  lVar7 = 0;
  if (bVar5) {
    lVar7 = -(ulong)((uint)uVar1 * 8);
  }
  if (((((TrackerData *)data != &Recycler::TrackerData::ExplicitFreeListObjectData) &&
       (pTVar3 = *(TrackerData **)
                  ((long)this + (ulong)uVar6 * 8 + (lVar7 - (ulong)(uVar1 + 7 & 0xfffffff8))),
       pTVar3 != &Recycler::TrackerData::ExplicitFreeListObjectData)) && (data != (void *)0x0)) &&
     (pTVar3 != (TrackerData *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x8e0,
                       "((existingTrackerData == nullptr || data == nullptr) || (existingTrackerData == &Recycler::TrackerData::ExplicitFreeListObjectData || data == &Recycler::TrackerData::ExplicitFreeListObjectData))"
                       ,
                       "(existingTrackerData == nullptr || data == nullptr) || (existingTrackerData == &Recycler::TrackerData::ExplicitFreeListObjectData || data == &Recycler::TrackerData::ExplicitFreeListObjectData)"
                      );
    if (!bVar5) {
LAB_0020536c:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar2 = 0;
  }
  uVar1 = this->objectCount;
  bVar5 = Recycler::DoProfileAllocTracker();
  lVar7 = 0;
  if (bVar5) {
    lVar7 = (ulong)uVar1 * -8;
  }
  *(void **)((long)this + (ulong)uVar6 * 8 + (lVar7 - (ulong)(uVar1 + 7 & 0xfffffff8))) = data;
  return;
}

Assistant:

void
SmallHeapBlockT<TBlockAttributes>::SetTrackerData(void * address, void * data)
{
    Assert(Recycler::DoProfileAllocTracker());
    ushort index = this->GetAddressIndex(address);
    Assert(index != SmallHeapBlockT<TBlockAttributes>::InvalidAddressBit);

    void* existingTrackerData = this->GetTrackerDataArray()[index];
    Assert((existingTrackerData == nullptr || data == nullptr) ||
        (existingTrackerData == &Recycler::TrackerData::ExplicitFreeListObjectData || data == &Recycler::TrackerData::ExplicitFreeListObjectData));
    this->GetTrackerDataArray()[index] = data;
}